

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BIT_STRING.c
# Opt level: O2

int BIT_STRING_print(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,asn_app_consume_bytes_f *cb,
                    void *app_key)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  char scratch [64];
  
  if ((sptr == (void *)0x0) || (pbVar3 = *sptr, pbVar3 == (byte *)0x0)) {
    iVar6 = (*cb)("<absent>",8,app_key);
    return iVar6 >> 0x1f;
  }
  pbVar2 = pbVar3 + *(int *)((long)sptr + 8);
  pcVar5 = scratch;
  for (; iVar6 = -1, pbVar3 < pbVar2; pbVar3 = pbVar3 + 1) {
    pcVar4 = pcVar5;
    if (((((int)pbVar3 - (int)*sptr & 0xfU) == 0) && (pbVar3 != *sptr)) &&
       (0x10 < *(int *)((long)sptr + 8))) {
      iVar1 = (*cb)("\n",1,app_key);
      if (iVar1 < 0) {
        return -1;
      }
      while (iVar6 = iVar6 + 1, iVar6 <= ilevel) {
        iVar1 = (*cb)(" ",1,app_key);
        if (iVar1 < 0) {
          return -1;
        }
      }
      pcVar4 = scratch;
      iVar6 = (*cb)(pcVar4,(long)pcVar5 - (long)pcVar4,app_key);
      if (iVar6 < 0) {
        return -1;
      }
    }
    *pcVar4 = "0123456789ABCDEF"[*pbVar3 >> 4];
    pcVar4[1] = "0123456789ABCDEF"[*pbVar3 & 0xf];
    pcVar4[2] = ' ';
    pcVar5 = pcVar4 + 3;
  }
  if (scratch < pcVar5) {
    if (0x10 < *(int *)((long)sptr + 8)) {
      iVar6 = (*cb)("\n",1,app_key);
      if (-1 < iVar6) {
        iVar6 = -1;
        do {
          iVar6 = iVar6 + 1;
          if (ilevel < iVar6) goto LAB_00148752;
          iVar1 = (*cb)(" ",1,app_key);
        } while (-1 < iVar1);
      }
      return -1;
    }
LAB_00148752:
    iVar6 = (*cb)(scratch,(size_t)(pcVar5 + (-1 - (long)scratch)),app_key);
    if (iVar6 < 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int
BIT_STRING_print(asn_TYPE_descriptor_t *td, const void *sptr, int ilevel,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	char scratch[64];
	const BIT_STRING_t *st = (const BIT_STRING_t *)sptr;
	uint8_t *buf;
	uint8_t *end;
	char *p = scratch;

	(void)td;	/* Unused argument */

	if(!st || !st->buf)
		return (cb("<absent>", 8, app_key) < 0) ? -1 : 0;

	ilevel++;
	buf = st->buf;
	end = buf + st->size;

	/*
	 * Hexadecimal dump.
	 */
	for(; buf < end; buf++) {
		if((buf - st->buf) % 16 == 0 && (st->size > 16)
				&& buf != st->buf) {
			_i_INDENT(1);
			/* Dump the string */
			if(cb(scratch, p - scratch, app_key) < 0) return -1;
			p = scratch;
		}
		*p++ = h2c[*buf >> 4];
		*p++ = h2c[*buf & 0x0F];
		*p++ = 0x20;
	}

	if(p > scratch) {
		p--;	/* Eat the tailing space */

		if((st->size > 16)) {
			_i_INDENT(1);
		}

		/* Dump the incomplete 16-bytes row */
		if(cb(scratch, p - scratch, app_key) < 0)
			return -1;
	}

	return 0;
}